

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

void AddThumb1SBit(MCInst *MI,_Bool InITBlock)

{
  ushort uVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  MCOperand *Op;
  ulong uVar5;
  MCOperandInfo *m;
  
  uVar3 = MCInst_getOpcode(MI);
  m = ARMInsts[uVar3].OpInfo;
  uVar3 = MCInst_getOpcode(MI);
  uVar1 = ARMInsts[uVar3].NumOperands;
  uVar3 = (uint)uVar1;
  if (uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar5 = 0;
    do {
      uVar4 = MCInst_getNumOperands(MI);
      if ((uVar5 == uVar4) ||
         (((_Var2 = MCOperandInfo_isOptionalDef(m), _Var2 && (m->RegClass == 0xc)) &&
          ((uVar5 == 0 || (_Var2 = MCOperandInfo_isPredicate(m + -1), !_Var2)))))) {
        uVar3 = (uint)uVar5;
        break;
      }
      uVar5 = uVar5 + 1;
      m = m + 1;
    } while (uVar1 != uVar5);
  }
  Op = MCOperand_CreateReg1(MI,(uint)!InITBlock + (uint)!InITBlock * 2);
  MCInst_insert0(MI,uVar3,Op);
  return;
}

Assistant:

static void AddThumb1SBit(MCInst *MI, bool InITBlock)
{
	MCOperandInfo *OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	unsigned short NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;
	unsigned i;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isOptionalDef(&OpInfo[i]) && OpInfo[i].RegClass == ARM_CCRRegClassID) {
			if (i > 0 && MCOperandInfo_isPredicate(&OpInfo[i-1])) continue;
			MCInst_insert0(MI, i, MCOperand_CreateReg1(MI, InITBlock ? 0 : ARM_CPSR));
			return;
		}
	}

	//MI.insert(I, MCOperand_CreateReg0(Inst, InITBlock ? 0 : ARM_CPSR));
	MCInst_insert0(MI, i, MCOperand_CreateReg1(MI, InITBlock ? 0 : ARM_CPSR));
}